

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_matrix_z2_ru_rep.cpp
# Opt level: O0

void RU_matrix_z2_rep_barcode_invoker::
     run<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,true>>>
               (type<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>_>
                *param_1)

{
  undefined8 uVar1;
  basic_wrap_stringstream<char> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  char local_8d9;
  basic_wrap_stringstream<char> local_8d8;
  basic_cstring<const_char> local_740;
  basic_cstring<const_char> local_730;
  char local_719;
  basic_wrap_stringstream<char> local_718;
  basic_cstring<const_char> local_580;
  basic_cstring<const_char> local_570;
  char local_559;
  basic_wrap_stringstream<char> local_558;
  basic_cstring<const_char> local_3c0;
  basic_cstring<const_char> local_3b0;
  char local_399;
  basic_wrap_stringstream<char> local_398;
  basic_cstring<const_char> local_200;
  basic_cstring<const_char> local_1f0;
  RU_matrix_z2_rep_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>_>
  local_1dd [8];
  RU_matrix_z2_rep_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>_>
  t;
  char local_1c9;
  basic_wrap_stringstream<char> local_1c8;
  basic_cstring<const_char> local_30;
  basic_cstring<const_char> local_20;
  type<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>_>
  *local_10;
  type<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>_>
  *param_0_local;
  
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_10 = param_1;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_matrix_z2_ru_rep.cpp"
             ,0x8e);
  memset(&local_1c8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_1c8);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_1c8);
  local_1c9 = '\"';
  pbVar2 = boost::operator<<(pbVar2,&local_1c9);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [25])"RU_matrix_z2_rep_barcode");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [15])"\" fixture ctor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_30,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_20,0x4d,&local_30);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_1c8);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_1f0,
             "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_matrix_z2_ru_rep.cpp"
             ,0x8e);
  memset(&local_398,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_398);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_398);
  local_399 = '\"';
  pbVar2 = boost::operator<<(pbVar2,&local_399);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [25])"RU_matrix_z2_rep_barcode");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [16])"\" fixture setup");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_200,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1f0,0x4d,&local_200);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_398);
  boost::unit_test::
  setup_conditional<RU_matrix_z2_rep_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,true>>>>
            (local_1dd);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_3b0,
             "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_matrix_z2_ru_rep.cpp"
             ,0x8e);
  memset(&local_558,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_558);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_558);
  local_559 = '\"';
  pbVar2 = boost::operator<<(pbVar2,&local_559);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [25])"RU_matrix_z2_rep_barcode");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [13])"\" test entry");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3c0,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3b0,0x4d,&local_3c0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_558);
  RU_matrix_z2_rep_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>_>
  ::test_method(local_1dd);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_570,
             "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_matrix_z2_ru_rep.cpp"
             ,0x8e);
  memset(&local_718,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_718);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_718);
  local_719 = '\"';
  pbVar2 = boost::operator<<(pbVar2,&local_719);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [25])"RU_matrix_z2_rep_barcode");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [19])"\" fixture teardown");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_580,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_570,0x4d,&local_580);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_718);
  boost::unit_test::
  teardown_conditional<RU_matrix_z2_rep_barcode<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,true>>>>
            (local_1dd);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_730,
             "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_matrix_z2_ru_rep.cpp"
             ,0x8e);
  memset(&local_8d8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_8d8);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_8d8);
  local_8d9 = '\"';
  pbVar2 = boost::operator<<(pbVar2,&local_8d9);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [25])"RU_matrix_z2_rep_barcode");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [15])"\" fixture dtor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_740,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_730,0x4d,&local_740);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_8d8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(RU_matrix_z2_rep_barcode, Matrix, full_matrices) {
  test_barcode<Matrix>();
  test_shifted_barcode<Matrix>();
}